

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall
xatlas::internal::param::JacobiPreconditioner::JacobiPreconditioner
          (JacobiPreconditioner *this,Matrix *M,bool symmetric)

{
  bool bVar1;
  uint32_t uVar2;
  float *pfVar3;
  float local_5c;
  float local_54;
  uint local_30;
  float elem;
  uint32_t x;
  bool symmetric_local;
  Matrix *M_local;
  JacobiPreconditioner *this_local;
  
  uVar2 = sparse::Matrix::width(M);
  FullVector::FullVector(&this->m_inverseDiagonal,uVar2);
  bVar1 = sparse::Matrix::isSquare(M);
  if ((!bVar1) && (s_print != (undefined *)0x0)) {
    (*(code *)s_print)("\rASSERT: %s %s %d\n","M.isSquare()",
                       "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                       ,0x164b);
  }
  for (local_30 = 0; uVar2 = sparse::Matrix::width(M), local_30 < uVar2; local_30 = local_30 + 1) {
    local_5c = sparse::Matrix::getCoefficient(M,local_30,local_30);
    if (symmetric) {
      if ((local_5c != 0.0) || (NAN(local_5c))) {
        local_54 = sqrtf(ABS(local_5c));
        local_54 = 1.0 / local_54;
      }
      else {
        local_54 = 1.0;
      }
      pfVar3 = FullVector::operator[](&this->m_inverseDiagonal,local_30);
      *pfVar3 = local_54;
    }
    else {
      if ((local_5c != 0.0) || (NAN(local_5c))) {
        local_5c = 1.0 / local_5c;
      }
      else {
        local_5c = 1.0;
      }
      pfVar3 = FullVector::operator[](&this->m_inverseDiagonal,local_30);
      *pfVar3 = local_5c;
    }
  }
  return;
}

Assistant:

JacobiPreconditioner(const sparse::Matrix &M, bool symmetric) : m_inverseDiagonal(M.width())
	{
		XA_ASSERT(M.isSquare());
		for (uint32_t x = 0; x < M.width(); x++) {
			float elem = M.getCoefficient(x, x);
			//XA_DEBUG_ASSERT( elem != 0.0f ); // This can be zero in the presence of zero area triangles.
			if (symmetric) {
				m_inverseDiagonal[x] = (elem != 0) ? 1.0f / sqrtf(fabsf(elem)) : 1.0f;
			} else {
				m_inverseDiagonal[x] = (elem != 0) ? 1.0f / elem : 1.0f;
			}
		}
	}